

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSurfaceNurbs.cpp
# Opt level: O3

void __thiscall
chrono::geometry::ChSurfaceNurbs::ChSurfaceNurbs(ChSurfaceNurbs *this,ChSurfaceNurbs *source)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  int iVar13;
  Index index;
  ulong uVar14;
  long lVar15;
  Index size;
  ActualDstType actualDst_2;
  ActualDstType actualDst_1;
  ActualDstType actualDst_3;
  ActualDstType actualDst;
  assign_op<chrono::ChVector<double>,_chrono::ChVector<double>_> local_42;
  assign_op<double,_double> local_41;
  ChMatrixDynamic<> *local_40;
  ChMatrixDynamic<ChVector<>_> *local_38;
  
  ChSurface::ChSurface(&this->super_ChSurface,&source->super_ChSurface);
  local_40 = &this->weights;
  local_38 = &this->points;
  (this->super_ChSurface).super_ChGeometry._vptr_ChGeometry =
       (_func_int **)&PTR__ChSurfaceNurbs_00b3f7b8;
  (this->points).super_PlainObjectBase<Eigen::Matrix<chrono::ChVector<double>,__1,__1,_1,__1,__1>_>.
  m_storage.m_data = (ChVector<double> *)0x0;
  (this->points).super_PlainObjectBase<Eigen::Matrix<chrono::ChVector<double>,__1,__1,_1,__1,__1>_>.
  m_storage.m_rows = 0;
  (this->points).super_PlainObjectBase<Eigen::Matrix<chrono::ChVector<double>,__1,__1,_1,__1,__1>_>.
  m_storage.m_cols = 0;
  (this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data
       = (double *)0x0;
  (this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
       = 0;
  (this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
       = 0;
  (this->knots_u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->knots_u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       0;
  (this->points).super_PlainObjectBase<Eigen::Matrix<chrono::ChVector<double>,__1,__1,_1,__1,__1>_>.
  m_storage.m_cols = 0;
  (this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data
       = (double *)0x0;
  (this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
       = 0;
  (this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
       = 0;
  (this->knots_u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->knots_u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       0;
  (this->knots_v).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->knots_v).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       0;
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<chrono::ChVector<double>,_1,_1,1,_1,_1>,Eigen::Matrix<chrono::ChVector<double>,_1,_1,1,_1,_1>,Eigen::internal::assign_op<chrono::ChVector<double>,chrono::ChVector<double>>>
            (local_38,&source->points,&local_42);
  iVar13 = source->p_v;
  this->p_u = source->p_u;
  this->p_v = iVar13;
  pdVar3 = (source->knots_u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data;
  uVar4 = (source->knots_u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
          .m_rows;
  if ((this->knots_u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_rows != uVar4) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&(this->knots_u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar4
               ,1);
    if ((this->knots_u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != uVar4) goto LAB_00812f73;
  }
  pdVar5 = (this->knots_u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  uVar14 = uVar4 + 7;
  if (-1 < (long)uVar4) {
    uVar14 = uVar4;
  }
  uVar14 = uVar14 & 0xfffffffffffffff8;
  if (7 < (long)uVar4) {
    lVar15 = 0;
    do {
      pdVar1 = pdVar3 + lVar15;
      dVar6 = pdVar1[1];
      dVar7 = pdVar1[2];
      dVar8 = pdVar1[3];
      dVar9 = pdVar1[4];
      dVar10 = pdVar1[5];
      dVar11 = pdVar1[6];
      dVar12 = pdVar1[7];
      pdVar2 = pdVar5 + lVar15;
      *pdVar2 = *pdVar1;
      pdVar2[1] = dVar6;
      pdVar2[2] = dVar7;
      pdVar2[3] = dVar8;
      pdVar2[4] = dVar9;
      pdVar2[5] = dVar10;
      pdVar2[6] = dVar11;
      pdVar2[7] = dVar12;
      lVar15 = lVar15 + 8;
    } while (lVar15 < (long)uVar14);
  }
  if ((long)uVar14 < (long)uVar4) {
    do {
      pdVar5[uVar14] = pdVar3[uVar14];
      uVar14 = uVar14 + 1;
    } while (uVar4 != uVar14);
  }
  pdVar3 = (source->knots_v).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data;
  uVar4 = (source->knots_v).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
          .m_rows;
  if ((this->knots_v).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_rows != uVar4) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&(this->knots_v).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar4
               ,1);
    if ((this->knots_v).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != uVar4) {
LAB_00812f73:
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
                   );
    }
  }
  pdVar5 = (this->knots_v).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  uVar14 = uVar4 + 7;
  if (-1 < (long)uVar4) {
    uVar14 = uVar4;
  }
  uVar14 = uVar14 & 0xfffffffffffffff8;
  if (7 < (long)uVar4) {
    lVar15 = 0;
    do {
      pdVar1 = pdVar3 + lVar15;
      dVar6 = pdVar1[1];
      dVar7 = pdVar1[2];
      dVar8 = pdVar1[3];
      dVar9 = pdVar1[4];
      dVar10 = pdVar1[5];
      dVar11 = pdVar1[6];
      dVar12 = pdVar1[7];
      pdVar2 = pdVar5 + lVar15;
      *pdVar2 = *pdVar1;
      pdVar2[1] = dVar6;
      pdVar2[2] = dVar7;
      pdVar2[3] = dVar8;
      pdVar2[4] = dVar9;
      pdVar2[5] = dVar10;
      pdVar2[6] = dVar11;
      pdVar2[7] = dVar12;
      lVar15 = lVar15 + 8;
    } while (lVar15 < (long)uVar14);
  }
  if ((long)uVar14 < (long)uVar4) {
    do {
      pdVar5[uVar14] = pdVar3[uVar14];
      uVar14 = uVar14 + 1;
    } while (uVar4 != uVar14);
  }
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::internal::assign_op<double,double>>
            (local_40,&source->weights,&local_41);
  return;
}

Assistant:

ChSurfaceNurbs::ChSurfaceNurbs(const ChSurfaceNurbs& source) : ChSurface(source) {
    this->points = source.points;
    this->p_u = source.p_u;
    this->p_v = source.p_v;
    this->knots_u = source.knots_u;
    this->knots_v = source.knots_v;
    this->weights = source.weights;
}